

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_block_link_
          (DaTrie<true,_false,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)block_pos;
  pBVar3 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 4) <= uVar4) {
    __assert_fail("block_pos < blocks.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x4e6,
                  "void ddd::DaTrie<true, false, true>::insert_block_link_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  uVar1 = this->head_pos_;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0xffffffff) {
    uVar2 = pBVar3[uVar5].prev;
    pBVar3[uVar4].prev = uVar2;
    pBVar3[uVar4].next = uVar1;
    pBVar3[uVar2].next = block_pos;
    pBVar3[uVar5].prev = block_pos;
    return;
  }
  pBVar3[uVar4].next = block_pos;
  pBVar3[uVar4].prev = block_pos;
  this->head_pos_ = block_pos;
  return;
}

Assistant:

void insert_block_link_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    assert(block_pos < blocks.size());

    if (head_pos_ != NOT_FOUND) {
      auto tail_pos = blocks[head_pos_].prev;
      blocks[block_pos].prev = tail_pos;
      blocks[block_pos].next = head_pos_;
      blocks[tail_pos].next = block_pos;
      blocks[head_pos_].prev = block_pos;
    } else {
      blocks[block_pos].next = block_pos;
      blocks[block_pos].prev = block_pos;
      head_pos_ = block_pos;
    }
  }